

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

uint __thiscall LinearScan::GetRemainingHelperLength(LinearScan *this,Lifetime *lifetime)

{
  IRKind IVar1;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  uint32 uVar7;
  undefined4 *puVar8;
  Type *pTVar9;
  uint uVar10;
  undefined1 auStack_48 [8];
  Iterator it;
  
  auStack_48 = (undefined1  [8])(this->opHelperBlockIter).list;
  it.list = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)
            (this->opHelperBlockIter).current;
  if ((it.list == (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
     ((undefined1  [8])it.list == auStack_48)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x11e6,"(it.IsValid())","it.IsValid()");
    if (!bVar4) {
LAB_00591946:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  uVar5 = IR::Instr::GetNumber(this->currentInstr);
  uVar3 = lifetime->end;
  if (lifetime->end < uVar5) {
    uVar3 = uVar5;
  }
  uVar10 = 0;
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    pTVar9 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)auStack_48);
    uVar5 = IR::Instr::GetNumber(&pTVar9->opHelperLabel->super_Instr);
    if (uVar5 <= uVar3) {
      uVar6 = IR::Instr::GetNumber(pTVar9->opHelperEndInstr);
      if (uVar3 < uVar6) {
        uVar6 = uVar3;
      }
      uVar10 = uVar10 + (uVar6 - uVar5);
      uVar7 = IR::Instr::GetNumber(pTVar9->opHelperEndInstr);
      if ((uVar6 != uVar7) ||
         ((IVar1 = pTVar9->opHelperEndInstr->m_kind, IVar1 != InstrKindLabel &&
          (IVar1 != InstrKindProfiledLabel)))) {
        uVar10 = uVar10 + 1;
      }
    }
    if (uVar3 < uVar5) {
      return uVar10;
    }
    if (it.list == (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) goto LAB_00591946;
      *puVar8 = 0;
    }
    it.list = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)
              ((it.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])it.list == auStack_48) {
      return uVar10;
    }
  } while( true );
}

Assistant:

uint LinearScan::GetRemainingHelperLength(Lifetime *const lifetime)
{
    // Walk the helper block linked list starting from the next helper block until the end of the lifetime
    uint helperLength = 0;
    SList<OpHelperBlock>::Iterator it(opHelperBlockIter);
    Assert(it.IsValid());
    const uint end = max(currentInstr->GetNumber(), lifetime->end);
    do
    {
        const OpHelperBlock &helper = it.Data();
        const uint helperStart = helper.opHelperLabel->GetNumber();
        if(helperStart > end)
        {
            break;
        }

        const uint helperEnd = min(end, helper.opHelperEndInstr->GetNumber());
        helperLength += helperEnd - helperStart;
        if(helperEnd != helper.opHelperEndInstr->GetNumber() || !helper.opHelperEndInstr->IsLabelInstr())
        {
            // A helper block that ends at a label does not return to the function. Since this helper block does not end
            // at a label, include the end instruction as well.
            ++helperLength;
        }
    } while(it.Next());

    return helperLength;
}